

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDescriptorPoolTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::outOfPoolMemoryTest(TestStatus *__return_storage_ptr__,Context *context)

{
  allocator<vk::VkDescriptorSetLayoutBinding> *this;
  allocator<vk::Handle<(vk::HandleType)19>_> *this_00;
  allocator<vk::Handle<(vk::HandleType)22>_> *this_01;
  uint uVar1;
  RefData<vk::Handle<(vk::HandleType)21>_> data;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  VkDevice pVVar2;
  VkDevice pVVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  size_type sVar8;
  Handle<(vk::HandleType)19> *__value;
  Handle<(vk::HandleType)21> *pHVar9;
  reference pvVar10;
  char *__s;
  FailureCase *local_ba8;
  allocator<char> local_a21;
  string local_a20;
  allocator<char> local_9f9;
  string local_9f8;
  MessageBuilder local_9d8;
  int local_858;
  allocator<char> local_851;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  VkResult local_7ec;
  undefined4 local_7e8;
  VkResult result;
  VkDescriptorSetAllocateInfo descriptorSetAllocateInfo;
  Handle<(vk::HandleType)22> local_7b8;
  undefined1 local_7b0 [8];
  vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
  rawDescriptorSets;
  undefined1 local_790 [8];
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  rawSetLayouts;
  RefData<vk::Handle<(vk::HandleType)19>_> local_758;
  undefined1 local_738 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkDescriptorSetLayoutCreateInfo descriptorSetLayoutInfo;
  undefined1 local_6f0 [8];
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  descriptorSetLayoutBindings;
  VkDescriptorSetLayoutBinding descriptorSetLayoutBinding;
  RefData<vk::Handle<(vk::HandleType)21>_> local_6a0;
  undefined1 local_680 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  VkDescriptorPoolCreateInfo descriptorPoolCreateInfo;
  VkDescriptorPoolSize descriptorPoolSize;
  MessageBuilder local_628;
  VkDescriptorType local_4a4;
  undefined1 local_4a0 [4];
  VkDescriptorType descriptorType;
  undefined4 *local_320;
  FailureCase *params;
  undefined1 local_310 [4];
  deUint32 failureCaseNdx;
  undefined1 local_189;
  allocator<char> local_188;
  allocator<char> local_187;
  allocator<char> local_186;
  allocator<char> local_185 [20];
  allocator<char> local_171;
  undefined1 *local_170;
  undefined1 local_168 [8];
  FailureCase failureCases [5];
  int local_44;
  const_iterator cStack_40;
  deUint32 numErrorsReturned;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  byte local_29;
  VkDevice pVStack_28;
  bool expectOutOfPoolMemoryError;
  VkDevice device;
  DeviceInterface *vkd;
  Context *context_local;
  
  vkd = (DeviceInterface *)context;
  context_local = (Context *)__return_storage_ptr__;
  device = (VkDevice)Context::getDeviceInterface(context);
  pVStack_28 = Context::getDevice((Context *)vkd);
  pvVar4 = Context::getDeviceExtensions_abi_cxx11_((Context *)vkd);
  local_38._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(pvVar4);
  pvVar4 = Context::getDeviceExtensions_abi_cxx11_((Context *)vkd);
  cStack_40 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(pvVar4);
  local_29 = de::
             contains<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char[20]>
                       (&local_38,&stack0xffffffffffffffc0,(char (*) [20])0x1365e6b);
  local_44 = 0;
  local_189 = 1;
  local_170 = local_168;
  local_168._0_4_ = 4;
  local_168._4_4_ = 2;
  failureCases[0].poolDescriptorCount = 1;
  failureCases[0].poolMaxSets = 1;
  failureCases[0].bindingCount = 3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&failureCases[0].descriptorSetCount,"Out of descriptor sets",&local_171);
  local_170 = (undefined1 *)((long)&failureCases[0].description.field_2 + 8);
  failureCases[0].description.field_2._8_4_ = 3;
  failureCases[0].description.field_2._12_4_ = 4;
  failureCases[1].poolDescriptorCount = 1;
  failureCases[1].poolMaxSets = 1;
  failureCases[1].bindingCount = 4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&failureCases[1].descriptorSetCount,
             "Out of descriptors (due to the number of sets)",local_185);
  local_170 = (undefined1 *)((long)&failureCases[1].description.field_2 + 8);
  failureCases[1].description.field_2._8_4_ = 2;
  failureCases[1].description.field_2._12_4_ = 1;
  failureCases[2].poolDescriptorCount = 3;
  failureCases[2].poolMaxSets = 1;
  failureCases[2].bindingCount = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&failureCases[2].descriptorSetCount,
             "Out of descriptors (due to the number of bindings)",&local_186);
  local_170 = (undefined1 *)((long)&failureCases[2].description.field_2 + 8);
  failureCases[2].description.field_2._8_4_ = 3;
  failureCases[2].description.field_2._12_4_ = 2;
  failureCases[3].poolDescriptorCount = 1;
  failureCases[3].poolMaxSets = 2;
  failureCases[3].bindingCount = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&failureCases[3].descriptorSetCount,
             "Out of descriptors (due to descriptor array size)",&local_187);
  local_170 = (undefined1 *)((long)&failureCases[3].description.field_2 + 8);
  failureCases[3].description.field_2._8_4_ = 5;
  failureCases[3].description.field_2._12_4_ = 1;
  failureCases[4].poolDescriptorCount = 2;
  failureCases[4].poolMaxSets = 3;
  failureCases[4].bindingCount = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&failureCases[4].descriptorSetCount,
             "Out of descriptors (due to descriptor array size in all bindings)",&local_188);
  local_189 = 0;
  std::allocator<char>::~allocator(&local_188);
  std::allocator<char>::~allocator(&local_187);
  std::allocator<char>::~allocator(&local_186);
  std::allocator<char>::~allocator(local_185);
  std::allocator<char>::~allocator(&local_171);
  pTVar5 = Context::getTestContext((Context *)vkd);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_310,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_310,
                      (char (*) [101])
                      "Creating a descriptor pool with insufficient resources. Descriptor set allocation is likely to fail."
                     );
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_310);
  for (params._4_4_ = 0; params._4_4_ < 5; params._4_4_ = params._4_4_ + 1) {
    local_320 = (undefined4 *)(local_168 + (ulong)params._4_4_ * 0x38);
    pTVar5 = Context::getTestContext((Context *)vkd);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_4a0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_4a0,(char (*) [11])"Checking: ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_320 + 6));
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_4a0);
    for (local_4a4 = VK_DESCRIPTOR_TYPE_SAMPLER; (int)local_4a4 < 0xb;
        local_4a4 = local_4a4 + VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) {
      pTVar5 = Context::getTestContext((Context *)vkd);
      pTVar6 = tcu::TestContext::getLog(pTVar5);
      tcu::TestLog::operator<<(&local_628,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_628,(char (*) [3])0x130dad8);
      descriptorPoolSize = (VkDescriptorPoolSize)::vk::getDescriptorTypeName(local_4a4);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char **)&descriptorPoolSize);
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_628);
      descriptorPoolCreateInfo.pPoolSizes._0_4_ = local_4a4;
      descriptorPoolCreateInfo.pPoolSizes._4_4_ = *local_320;
      descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator._0_4_
           = 0x21;
      descriptorPoolCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      descriptorPoolCreateInfo._4_4_ = 0;
      descriptorPoolCreateInfo.pNext._0_4_ = 0;
      descriptorPoolCreateInfo.pNext._4_4_ = local_320[1];
      descriptorPoolCreateInfo.flags = 1;
      descriptorPoolCreateInfo._24_8_ = &descriptorPoolCreateInfo.pPoolSizes;
      ::vk::createDescriptorPool
                ((Move<vk::Handle<(vk::HandleType)21>_> *)
                 &descriptorSetLayoutBinding.pImmutableSamplers,(DeviceInterface *)device,pVStack_28
                 ,(VkDescriptorPoolCreateInfo *)
                  &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
                   m_allocator,(VkAllocationCallbacks *)0x0);
      ::vk::refdetails::Move::operator_cast_to_RefData
                (&local_6a0,(Move *)&descriptorSetLayoutBinding.pImmutableSamplers);
      data.deleter.m_deviceIface = local_6a0.deleter.m_deviceIface;
      data.object.m_internal = local_6a0.object.m_internal;
      data.deleter.m_device = local_6a0.deleter.m_device;
      data.deleter.m_allocator = local_6a0.deleter.m_allocator;
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
                ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_680,data);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)21>_> *)
                 &descriptorSetLayoutBinding.pImmutableSamplers);
      descriptorSetLayoutBindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      descriptorSetLayoutBindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_4a4;
      descriptorSetLayoutBinding.binding = local_320[3];
      descriptorSetLayoutBinding.descriptorType = 0x7fffffff;
      descriptorSetLayoutBinding.descriptorCount = 0;
      descriptorSetLayoutBinding.stageFlags = 0;
      uVar1 = local_320[2];
      this = (allocator<vk::VkDescriptorSetLayoutBinding> *)
             ((long)&descriptorSetLayoutInfo.pBindings + 7);
      std::allocator<vk::VkDescriptorSetLayoutBinding>::allocator(this);
      std::
      vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
      vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              *)local_6f0,(ulong)uVar1,
             (value_type *)
             &descriptorSetLayoutBindings.
              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
      std::allocator<vk::VkDescriptorSetLayoutBinding>::~allocator
                ((allocator<vk::VkDescriptorSetLayoutBinding> *)
                 ((long)&descriptorSetLayoutInfo.pBindings + 7));
      descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
      _0_4_ = 0x20;
      descriptorSetLayoutInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      descriptorSetLayoutInfo._4_4_ = 0;
      descriptorSetLayoutInfo.pNext._0_4_ = 0;
      sVar8 = std::
              vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              ::size((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                      *)local_6f0);
      descriptorSetLayoutInfo.pNext._4_4_ = (undefined4)sVar8;
      descriptorSetLayoutInfo._16_8_ =
           std::
           vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ::operator[]((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                         *)local_6f0,0);
      ::vk::createDescriptorSetLayout
                ((Move<vk::Handle<(vk::HandleType)19>_> *)
                 &rawSetLayouts.
                  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(DeviceInterface *)device,
                 pVStack_28,
                 (VkDescriptorSetLayoutCreateInfo *)
                 &descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                  m_allocator,(VkAllocationCallbacks *)0x0);
      ::vk::refdetails::Move::operator_cast_to_RefData
                (&local_758,
                 (Move *)&rawSetLayouts.
                          super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      data_00.deleter.m_deviceIface = local_758.deleter.m_deviceIface;
      data_00.object.m_internal = local_758.object.m_internal;
      data_00.deleter.m_device = local_758.deleter.m_device;
      data_00.deleter.m_allocator = local_758.deleter.m_allocator;
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
                ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_738,data_00);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)19>_> *)
                 &rawSetLayouts.
                  super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      uVar1 = local_320[4];
      __value = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_738);
      this_00 = (allocator<vk::Handle<(vk::HandleType)19>_> *)
                ((long)&rawDescriptorSets.
                        super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<vk::Handle<(vk::HandleType)19>_>::allocator(this_00);
      std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ::vector((vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                *)local_790,(ulong)uVar1,__value,this_00);
      std::allocator<vk::Handle<(vk::HandleType)19>_>::~allocator
                ((allocator<vk::Handle<(vk::HandleType)19>_> *)
                 ((long)&rawDescriptorSets.
                         super__Vector_base<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      uVar1 = local_320[4];
      ::vk::Handle<(vk::HandleType)22>::Handle(&local_7b8,0);
      this_01 = (allocator<vk::Handle<(vk::HandleType)22>_> *)
                ((long)&descriptorSetAllocateInfo.pSetLayouts + 7);
      std::allocator<vk::Handle<(vk::HandleType)22>_>::allocator(this_01);
      std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
      ::vector((vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                *)local_7b0,(ulong)uVar1,&local_7b8,this_01);
      std::allocator<vk::Handle<(vk::HandleType)22>_>::~allocator
                ((allocator<vk::Handle<(vk::HandleType)22>_> *)
                 ((long)&descriptorSetAllocateInfo.pSetLayouts + 7));
      local_7e8 = 0x22;
      descriptorSetAllocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      descriptorSetAllocateInfo._4_4_ = 0;
      pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                         ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_680);
      descriptorSetAllocateInfo.pNext = (void *)pHVar9->m_internal;
      sVar8 = std::
              vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
              ::size((vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                      *)local_790);
      descriptorSetAllocateInfo.descriptorPool.m_internal._0_4_ = (undefined4)sVar8;
      descriptorSetAllocateInfo._24_8_ =
           std::
           vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
           ::operator[]((vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                         *)local_790,0);
      pVVar3 = device;
      pVVar2 = pVStack_28;
      pvVar10 = std::
                vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                ::operator[]((vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                              *)local_7b0,0);
      local_7ec = (**(code **)(*(long *)pVVar3 + 0x1e0))(pVVar3,pVVar2,&local_7e8,pvVar10);
      if (local_7ec == VK_SUCCESS) {
        pTVar5 = Context::getTestContext((Context *)vkd);
        pTVar6 = tcu::TestContext::getLog(pTVar5);
        tcu::TestLog::operator<<(&local_9d8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar7 = tcu::MessageBuilder::operator<<
                           (&local_9d8,(char (*) [35])"  Allocation was successful anyway");
        tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_9d8);
LAB_008cd5dd:
        local_858 = 0;
      }
      else {
        local_44 = local_44 + 1;
        if (((local_29 & 1) == 0) || (local_7ec == VK_ERROR_OUT_OF_POOL_MEMORY_KHR))
        goto LAB_008cd5dd;
        __s = ::vk::getResultName(local_7ec);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_850,__s,&local_851);
        std::operator+(&local_830,"Expected VK_ERROR_OUT_OF_POOL_MEMORY_KHR but got ",&local_850);
        std::operator+(&local_810,&local_830," instead");
        tcu::TestStatus::fail(__return_storage_ptr__,&local_810);
        std::__cxx11::string::~string((string *)&local_810);
        std::__cxx11::string::~string((string *)&local_830);
        std::__cxx11::string::~string((string *)&local_850);
        std::allocator<char>::~allocator(&local_851);
        local_858 = 1;
      }
      std::vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
      ::~vector((vector<vk::Handle<(vk::HandleType)22>,_std::allocator<vk::Handle<(vk::HandleType)22>_>_>
                 *)local_7b0);
      std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
      ::~vector((vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                 *)local_790);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_738);
      std::
      vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
      ~vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
               *)local_6f0);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_680);
      if (local_858 != 0) goto LAB_008cd800;
    }
  }
  if (local_44 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9f8,"Not validated",&local_9f9);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_9f8);
    std::__cxx11::string::~string((string *)&local_9f8);
    std::allocator<char>::~allocator(&local_9f9);
    local_858 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a20,"Pass",&local_a21);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_a20);
    std::__cxx11::string::~string((string *)&local_a20);
    std::allocator<char>::~allocator(&local_a21);
    local_858 = 1;
  }
LAB_008cd800:
  local_ba8 = (FailureCase *)((long)&failureCases[4].description.field_2 + 8);
  do {
    local_ba8 = local_ba8 + -1;
    outOfPoolMemoryTest::FailureCase::~FailureCase(local_ba8);
  } while (local_ba8 != (FailureCase *)local_168);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus outOfPoolMemoryTest (Context& context)
{
	const DeviceInterface&	vkd							= context.getDeviceInterface();
	const VkDevice			device						= context.getDevice();
	const bool				expectOutOfPoolMemoryError	= de::contains(context.getDeviceExtensions().begin(), context.getDeviceExtensions().end(), "VK_KHR_maintenance1");
	deUint32				numErrorsReturned			= 0;

	const struct FailureCase
	{
		deUint32	poolDescriptorCount;		//!< total number of descriptors (of a given type) in the descriptor pool
		deUint32	poolMaxSets;				//!< max number of descriptor sets that can be allocated from the pool
		deUint32	bindingCount;				//!< number of bindings per descriptor set layout
		deUint32	bindingDescriptorCount;		//!< number of descriptors in a binding (array size) (in all bindings)
		deUint32	descriptorSetCount;			//!< number of descriptor sets to allocate
		string		description;				//!< the log message for this failure condition
	} failureCases[] =
	{
		//	pool			pool		binding		binding		alloc set
		//	descr. count	max sets	count		array size	count
		{	4u,				2u,			1u,			1u,			3u,		"Out of descriptor sets",											},
		{	3u,				4u,			1u,			1u,			4u,		"Out of descriptors (due to the number of sets)",					},
		{	2u,				1u,			3u,			1u,			1u,		"Out of descriptors (due to the number of bindings)",				},
		{	3u,				2u,			1u,			2u,			2u,		"Out of descriptors (due to descriptor array size)",				},
		{	5u,				1u,			2u,			3u,			1u,		"Out of descriptors (due to descriptor array size in all bindings)",},
	};

	context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Creating a descriptor pool with insufficient resources. Descriptor set allocation is likely to fail."
		<< tcu::TestLog::EndMessage;

	for (deUint32 failureCaseNdx = 0u; failureCaseNdx < DE_LENGTH_OF_ARRAY(failureCases); ++failureCaseNdx)
	{
		const FailureCase& params = failureCases[failureCaseNdx];
		context.getTestContext().getLog() << tcu::TestLog::Message << "Checking: " << params.description << tcu::TestLog::EndMessage;

		for (VkDescriptorType	descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
								descriptorType < VK_DESCRIPTOR_TYPE_LAST;
								descriptorType = static_cast<VkDescriptorType>(descriptorType + 1))
		{
			context.getTestContext().getLog() << tcu::TestLog::Message << "- " << getDescriptorTypeName(descriptorType) << tcu::TestLog::EndMessage;

			const VkDescriptorPoolSize					descriptorPoolSize =
			{
				descriptorType,												// type
				params.poolDescriptorCount,									// descriptorCount
			};

			const VkDescriptorPoolCreateInfo			descriptorPoolCreateInfo =
			{
				VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,				// VkStructureType                sType;
				DE_NULL,													// const void*                    pNext;
				(VkDescriptorPoolCreateFlags)0,								// VkDescriptorPoolCreateFlags    flags;
				params.poolMaxSets,											// uint32_t                       maxSets;
				1u,															// uint32_t                       poolSizeCount;
				&descriptorPoolSize,										// const VkDescriptorPoolSize*    pPoolSizes;
			};

			const Unique<VkDescriptorPool>				descriptorPool(createDescriptorPool(vkd, device, &descriptorPoolCreateInfo));

			const VkDescriptorSetLayoutBinding			descriptorSetLayoutBinding =
			{
				0u,															// uint32_t              binding;
				descriptorType,												// VkDescriptorType      descriptorType;
				params.bindingDescriptorCount,								// uint32_t              descriptorCount;
				VK_SHADER_STAGE_ALL,										// VkShaderStageFlags    stageFlags;
				DE_NULL,													// const VkSampler*      pImmutableSamplers;
			};

			const vector<VkDescriptorSetLayoutBinding>	descriptorSetLayoutBindings (params.bindingCount, descriptorSetLayoutBinding);
			const VkDescriptorSetLayoutCreateInfo		descriptorSetLayoutInfo =
			{
				VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,		// VkStructureType                        sType;
				DE_NULL,													// const void*                            pNext;
				(VkDescriptorSetLayoutCreateFlags)0,						// VkDescriptorSetLayoutCreateFlags       flags;
				static_cast<deUint32>(descriptorSetLayoutBindings.size()),	// uint32_t                               bindingCount;
				&descriptorSetLayoutBindings[0],							// const VkDescriptorSetLayoutBinding*    pBindings;
			};

			const Unique<VkDescriptorSetLayout>			descriptorSetLayout	(createDescriptorSetLayout(vkd, device, &descriptorSetLayoutInfo));
			const vector<VkDescriptorSetLayout>			rawSetLayouts		(params.descriptorSetCount, *descriptorSetLayout);
			vector<VkDescriptorSet>						rawDescriptorSets	(params.descriptorSetCount, DE_NULL);

			const VkDescriptorSetAllocateInfo			descriptorSetAllocateInfo =
			{
				VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,				// VkStructureType                 sType;
				DE_NULL,													// const void*                     pNext;
				*descriptorPool,											// VkDescriptorPool                descriptorPool;
				static_cast<deUint32>(rawSetLayouts.size()),				// uint32_t                        descriptorSetCount;
				&rawSetLayouts[0],											// const VkDescriptorSetLayout*    pSetLayouts;
			};

			const VkResult result = vkd.allocateDescriptorSets(device, &descriptorSetAllocateInfo, &rawDescriptorSets[0]);

			if (result != VK_SUCCESS)
			{
				++numErrorsReturned;

				if (expectOutOfPoolMemoryError && result != VK_ERROR_OUT_OF_POOL_MEMORY_KHR)
					return tcu::TestStatus::fail("Expected VK_ERROR_OUT_OF_POOL_MEMORY_KHR but got " + string(getResultName(result)) + " instead");
			}
			else
				context.getTestContext().getLog() << tcu::TestLog::Message << "  Allocation was successful anyway" << tcu::TestLog::EndMessage;
		}
	}

	if (numErrorsReturned == 0u)
		return tcu::TestStatus::pass("Not validated");
	else
		return tcu::TestStatus::pass("Pass");
}